

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_av1d_vdpu383.c
# Opt level: O0

void vdpu383_av1d_set_cdf(Av1dHalCtx *p_hal,DXVA_PicParams_AV1 *dxva)

{
  uint uVar1;
  long *plVar2;
  long lVar3;
  int iVar4;
  HalBuf *pHVar5;
  int local_50;
  int local_4c;
  MppBuffer local_48;
  MppBuffer buf_tmp;
  RK_U32 i;
  HalBuf *cdf_buf;
  RK_U32 mapped_idx;
  RK_U32 coeff_cdf_idx;
  Vdpu383Av1dRegSet *regs;
  Vdpu383Av1dRegCtx *reg_ctx;
  DXVA_PicParams_AV1 *dxva_local;
  Av1dHalCtx *p_hal_local;
  
  plVar2 = (long *)p_hal->reg_ctx;
  lVar3 = *plVar2;
  if ((dxva->format).frame_type == '\0') {
    for (buf_tmp._4_4_ = 0; buf_tmp._4_4_ < 8; buf_tmp._4_4_ = buf_tmp._4_4_ + 1) {
      *(undefined4 *)((long)plVar2 + (ulong)buf_tmp._4_4_ * 0x28 + 0x124) = 0;
    }
  }
  if ((dxva->quantization).base_qindex < 0x15) {
    local_4c = 0;
  }
  else {
    if ((dxva->quantization).base_qindex < 0x3d) {
      local_50 = 1;
    }
    else {
      local_50 = 3;
      if ((dxva->quantization).base_qindex < 0x79) {
        local_50 = 2;
      }
    }
    local_4c = local_50;
  }
  cdf_buf._4_4_ = local_4c;
  if (((dxva->format).frame_type == '\0') || (dxva->primary_ref_frame == '\a')) {
    iVar4 = mpp_buffer_get_fd_with_caller((MppBuffer)plVar2[0x4b],"vdpu383_av1d_set_cdf");
    *(int *)(lVar3 + 0x1d4) = iVar4;
    iVar4 = mpp_buffer_get_fd_with_caller((MppBuffer)plVar2[0x4b],"vdpu383_av1d_set_cdf");
    *(int *)(lVar3 + 0x1bc) = iVar4;
  }
  else {
    uVar1 = dxva->ref_frame_idx[dxva->primary_ref_frame];
    cdf_buf._4_4_ = (int)plVar2[(ulong)uVar1 * 5 + 0x25];
    if ((((ulong)dxva->field_10 >> 0x1d & 1) == 0) &&
       (*(int *)((long)plVar2 + (ulong)uVar1 * 0x28 + 0x124) != 0)) {
      pHVar5 = hal_bufs_get_buf((HalBufs)plVar2[0x4c],(int)dxva->frame_refs[uVar1].Index);
      local_48 = *pHVar5->buf;
    }
    else {
      local_48 = (MppBuffer)plVar2[0x4b];
    }
    iVar4 = mpp_buffer_get_fd_with_caller(local_48,"vdpu383_av1d_set_cdf");
    *(int *)(lVar3 + 0x1d4) = iVar4;
    iVar4 = mpp_buffer_get_fd_with_caller(local_48,"vdpu383_av1d_set_cdf");
    *(int *)(lVar3 + 0x1bc) = iVar4;
    iVar4 = mpp_buffer_get_fd_with_caller(local_48,"vdpu383_av1d_set_cdf");
    *(int *)(lVar3 + 0x1c8) = iVar4;
  }
  pHVar5 = hal_bufs_get_buf((HalBufs)plVar2[0x4c],(uint)((dxva->CurrPic).field_0.bPicEntry & 0x7f));
  iVar4 = mpp_buffer_get_fd_with_caller(*pHVar5->buf,"vdpu383_av1d_set_cdf");
  *(int *)(lVar3 + 0x1d8) = iVar4;
  iVar4 = mpp_buffer_get_fd_with_caller(*pHVar5->buf,"vdpu383_av1d_set_cdf");
  *(int *)(lVar3 + 0x1c0) = iVar4;
  iVar4 = mpp_buffer_get_fd_with_caller(*pHVar5->buf,"vdpu383_av1d_set_cdf");
  *(int *)(lVar3 + 0x1cc) = iVar4;
  mpp_dev_set_reg_offset(p_hal->dev,0xb2,cdf_buf._4_4_ * 0x1620 + 0x1b20);
  mpp_dev_set_reg_offset(p_hal->dev,0xb3,0x1b20);
  mpp_dev_set_reg_offset(p_hal->dev,0xb5,0x73a0);
  mpp_dev_set_reg_offset(p_hal->dev,0xb6,0x73a0);
  for (buf_tmp._4_4_ = 0; buf_tmp._4_4_ < 8; buf_tmp._4_4_ = buf_tmp._4_4_ + 1) {
    if (((uint)dxva->refresh_frame_flags & 1 << ((byte)buf_tmp._4_4_ & 0x1f)) != 0) {
      if (((ulong)dxva->field_10 >> 0x1d & 1) == 0) {
        *(undefined4 *)((long)plVar2 + (ulong)buf_tmp._4_4_ * 0x28 + 0x124) = 1;
        *(undefined4 *)(plVar2 + (ulong)buf_tmp._4_4_ * 5 + 0x25) = 0;
      }
      else if ((dxva->show_existing_frame == 0) || ((dxva->format).frame_type != '\0')) {
        *(int *)(plVar2 + (ulong)buf_tmp._4_4_ * 5 + 0x25) = cdf_buf._4_4_;
      }
      else {
        *(int *)(plVar2 + (ulong)buf_tmp._4_4_ * 5 + 0x25) =
             (int)plVar2[(ulong)dxva->frame_to_show_map_idx * 5 + 0x25];
      }
    }
  }
  return;
}

Assistant:

static void vdpu383_av1d_set_cdf(Av1dHalCtx *p_hal, DXVA_PicParams_AV1 *dxva)
{
    Vdpu383Av1dRegCtx *reg_ctx = (Vdpu383Av1dRegCtx *)p_hal->reg_ctx;
    Vdpu383Av1dRegSet *regs = reg_ctx->regs;
    RK_U32 coeff_cdf_idx = 0;
    RK_U32 mapped_idx = 0;
    HalBuf *cdf_buf = NULL;
    RK_U32 i = 0;
    MppBuffer buf_tmp = NULL;

    /* use para in decoder */
#ifdef DUMP_AV1D_VDPU383_DATAS
    {
        char *cur_fname = "cabac_cdf_in.dat";
        memset(dump_cur_fname_path, 0, sizeof(dump_cur_fname_path));
        sprintf(dump_cur_fname_path, "%s/%s", dump_cur_dir, cur_fname);
    }
#endif
    if (dxva->format.frame_type == AV1_FRAME_KEY)
        for (i = 0; i < NUM_REF_FRAMES; i++)
            reg_ctx->ref_info_tbl[i].cdf_valid = 0;
    /* def coeff cdf idx */
    coeff_cdf_idx = dxva->quantization.base_qindex <= 20 ? 0 :
                    dxva->quantization.base_qindex <= 60  ? 1 :
                    dxva->quantization.base_qindex <= 120 ? 2 : 3;

    if (dxva->format.frame_type == AV1_FRAME_KEY ||
        dxva->primary_ref_frame == 7) { /* AV1_PRIMARY_REF_NONE */
        regs->av1d_addrs.reg184_av1_noncoef_rd_base = mpp_buffer_get_fd(reg_ctx->cdf_rd_def_base);
        regs->av1d_addrs.reg178_av1_coef_rd_base = mpp_buffer_get_fd(reg_ctx->cdf_rd_def_base);
#ifdef DUMP_AV1D_VDPU383_DATAS
        {
            dump_data_to_file(dump_cur_fname_path, (void *)mpp_buffer_get_ptr(reg_ctx->cdf_rd_def_base),
                              8 * NON_COEF_CDF_SIZE, 128, 0, 0);
            dump_data_to_file(dump_cur_fname_path, (RK_U8 *)mpp_buffer_get_ptr(reg_ctx->cdf_rd_def_base)
                              + NON_COEF_CDF_SIZE + COEF_CDF_SIZE * coeff_cdf_idx,
                              8 * COEF_CDF_SIZE, 128, 0, 1);
        }
#endif
    } else {
        mapped_idx = dxva->ref_frame_idx[dxva->primary_ref_frame];

        coeff_cdf_idx = reg_ctx->ref_info_tbl[mapped_idx].coeff_idx;
        if (!dxva->coding.disable_frame_end_update_cdf &&
            reg_ctx->ref_info_tbl[mapped_idx].cdf_valid) {
            cdf_buf = hal_bufs_get_buf(reg_ctx->cdf_bufs, dxva->frame_refs[mapped_idx].Index);
            buf_tmp = cdf_buf->buf[0];
        } else {
            buf_tmp = reg_ctx->cdf_rd_def_base;
        }
        regs->av1d_addrs.reg184_av1_noncoef_rd_base = mpp_buffer_get_fd(buf_tmp);
        regs->av1d_addrs.reg178_av1_coef_rd_base = mpp_buffer_get_fd(buf_tmp);
        regs->av1d_addrs.reg181_av1_rd_segid_base = mpp_buffer_get_fd(buf_tmp);
#ifdef DUMP_AV1D_VDPU383_DATAS
        {
            dump_data_to_file(dump_cur_fname_path, (void *)mpp_buffer_get_ptr(buf_tmp),
                              8 * NON_COEF_CDF_SIZE, 128, 0, 0);
            dump_data_to_file(dump_cur_fname_path, (RK_U8 *)mpp_buffer_get_ptr(buf_tmp)
                              + NON_COEF_CDF_SIZE + COEF_CDF_SIZE * coeff_cdf_idx,
                              8 * COEF_CDF_SIZE, 128, 0, 1);
        }
#endif
    }
    cdf_buf = hal_bufs_get_buf(reg_ctx->cdf_bufs, dxva->CurrPic.Index7Bits);
    regs->av1d_addrs.reg185_av1_noncoef_wr_base = mpp_buffer_get_fd(cdf_buf->buf[0]);
    regs->av1d_addrs.reg179_av1_coef_wr_base = mpp_buffer_get_fd(cdf_buf->buf[0]);
    regs->av1d_addrs.reg182_av1_wr_segid_base = mpp_buffer_get_fd(cdf_buf->buf[0]);

    /* byte, 434 x 128 bit = 434 x 16 byte */
    mpp_dev_set_reg_offset(p_hal->dev, 178, NON_COEF_CDF_SIZE + COEF_CDF_SIZE * coeff_cdf_idx);
    mpp_dev_set_reg_offset(p_hal->dev, 179, NON_COEF_CDF_SIZE);
    mpp_dev_set_reg_offset(p_hal->dev, 181, ALL_CDF_SIZE);
    mpp_dev_set_reg_offset(p_hal->dev, 182, ALL_CDF_SIZE);

    /* update params sync with "update buffer" */
    for (i = 0; i < NUM_REF_FRAMES; i++) {
        if (dxva->refresh_frame_flags & (1 << i)) {
            if (dxva->coding.disable_frame_end_update_cdf) {
                if (dxva->show_existing_frame && dxva->format.frame_type == AV1_FRAME_KEY)
                    reg_ctx->ref_info_tbl[i].coeff_idx
                        = reg_ctx->ref_info_tbl[dxva->frame_to_show_map_idx].coeff_idx;
                else
                    reg_ctx->ref_info_tbl[i].coeff_idx = coeff_cdf_idx;
            } else {
                reg_ctx->ref_info_tbl[i].cdf_valid = 1;
                reg_ctx->ref_info_tbl[i].coeff_idx = 0;
            }
        }
    }

#ifdef DUMP_AV1D_VDPU383_DATAS
    {
        char *cur_fname = "cdf_rd_def.dat";
        memset(dump_cur_fname_path, 0, sizeof(dump_cur_fname_path));
        sprintf(dump_cur_fname_path, "%s/%s", dump_cur_dir, cur_fname);
        dump_data_to_file(dump_cur_fname_path, (void *)mpp_buffer_get_ptr(reg_ctx->cdf_rd_def_base),
                          (NON_COEF_CDF_SIZE + COEF_CDF_SIZE * 4) * 8, 128, 0, 0);
    }
#endif

}